

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O2

void __thiscall
TTD::EventLog::RecordJsRTCreateSyntaxError
          (EventLog *this,TTDJsRTActionResultAutoRecorder *actionPopper,Var msg)

{
  EventLogEntry *actionEvent;
  JsRTVarsArgumentAction_InternalUse<1UL> *local_28;
  JsRTSingleVarArgumentAction *sAction;
  
  local_28 = (JsRTVarsArgumentAction_InternalUse<1UL> *)0x0;
  actionEvent = RecordGetInitializedEvent<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<1ul>,(TTD::NSLogEvents::EventKind)26>
                          (this,&local_28);
  local_28->VarArray[0] = msg;
  TTDJsRTActionResultAutoRecorder::InitializeWithEventAndEnterWResult
            (actionPopper,actionEvent,&local_28->Result);
  return;
}

Assistant:

void EventLog::RecordJsRTCreateSyntaxError(TTDJsRTActionResultAutoRecorder& actionPopper, Js::Var msg)
    {
        NSLogEvents::JsRTSingleVarArgumentAction* sAction = nullptr;
        NSLogEvents::EventLogEntry* evt = this->RecordGetInitializedEvent<NSLogEvents::JsRTSingleVarArgumentAction, NSLogEvents::EventKind::CreateSyntaxErrorActionTag>(&sAction);
        NSLogEvents::SetVarItem_0(sAction, TTD_CONVERT_JSVAR_TO_TTDVAR(msg));

        actionPopper.InitializeWithEventAndEnterWResult(evt, &(sAction->Result));
    }